

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O2

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,PlugInInfo *plugIn)

{
  CppUnitTestPlugIn *pCVar1;
  DynamicLibraryManager *this_00;
  TestFactoryRegistry *pTVar2;
  string local_40;
  allocator<char> local_19;
  
  pCVar1 = plugIn->m_interface;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"All Tests",&local_19);
  pTVar2 = TestFactoryRegistry::getRegistry(&local_40);
  (*pCVar1->_vptr_CppUnitTestPlugIn[5])(pCVar1,pTVar2);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = plugIn->m_manager;
  if (this_00 != (DynamicLibraryManager *)0x0) {
    DynamicLibraryManager::~DynamicLibraryManager(this_00);
  }
  operator_delete(this_00,0x28);
  return;
}

Assistant:

void 
PlugInManager::unload( PlugInInfo &plugIn )
{
  try
  {
    plugIn.m_interface->uninitialize( &TestFactoryRegistry::getRegistry() );
    delete plugIn.m_manager;
  }
  catch (...)
  {
    delete plugIn.m_manager;
    plugIn.m_manager = NULL;
    throw;
  }
}